

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O2

Int __thiscall ipx::Control::InterruptCheck(Control *this,Int ipm_iteration_count)

{
  HighsCallback *pHVar1;
  bool bVar2;
  HighsSplitDeque *this_00;
  double dVar3;
  reference rVar4;
  allocator local_39;
  double local_38;
  string local_30;
  
  this_00 = HighsTaskExecutor::getThisWorkerDeque();
  HighsSplitDeque::checkInterrupt(this_00);
  dVar3 = (this->parameters_).super_ipx_parameters.time_limit;
  if ((0.0 <= dVar3) && (local_38 = dVar3, dVar3 = Timer::Elapsed(&this->timer_), local_38 < dVar3))
  {
    return 999;
  }
  pHVar1 = this->callback_;
  if (((pHVar1 != (HighsCallback *)0x0) &&
      ((pHVar1->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     (rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&pHVar1->active,2),
     (*rVar4._M_p & rVar4._M_mask) != 0)) {
    HighsCallback::clearHighsCallbackDataOut(this->callback_);
    pHVar1 = this->callback_;
    (pHVar1->data_out).ipm_iteration_count = ipm_iteration_count;
    std::__cxx11::string::string((string *)&local_30,"IPM interrupt",&local_39);
    bVar2 = HighsCallback::callbackAction(pHVar1,2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (bVar2) {
      return 0x3e6;
    }
  }
  return 0;
}

Assistant:

Int Control::InterruptCheck(const Int ipm_iteration_count) const {
    HighsTaskExecutor::getThisWorkerDeque()->checkInterrupt();
    if (parameters_.time_limit >= 0.0 &&
        parameters_.time_limit < timer_.Elapsed())
        return IPX_ERROR_time_interrupt;
    // The pointer callback_ should not be null, since that indicates
    // that it's not been set
    assert(callback_);
    if (callback_) {
      if (callback_->user_callback && callback_->active[kCallbackIpmInterrupt]) {
	callback_->clearHighsCallbackDataOut();
	callback_->data_out.ipm_iteration_count = ipm_iteration_count;
	if (callback_->callbackAction(kCallbackIpmInterrupt,
				      "IPM interrupt"))
	  return IPX_ERROR_user_interrupt;
      }
    }
    return 0;
}